

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_relative_path(void)

{
  int iVar1;
  int extraout_EAX;
  char *__s;
  size_t sVar2;
  uv_loop_t *puVar3;
  char *handle;
  int64_t eval_b;
  int64_t eval_a;
  void *local_20;
  
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar1 = uv_exepath(exepath,&exepath_size);
  local_20 = (void *)(long)iVar1;
  if (local_20 == (void *)0x0) {
    exepath[exepath_size] = '\0';
    __s = strrchr(exepath,0x2f);
    if (__s == (char *)0x0) {
      handle = exepath;
      __s = strrchr(exepath,0x5c);
      if (__s == (char *)0x0) goto LAB_001c0f44;
    }
    sVar2 = strlen(__s);
    memmove(__s + 2,__s,sVar2 + 1);
    __s[0] = '\0';
    __s[1] = '.';
    __s[2] = '/';
    options.file = __s + 1;
    options.cwd = exepath;
    *options.args = options.file;
    puVar3 = uv_default_loop();
    iVar1 = uv_spawn(puVar3,&process,&options);
    local_20 = (void *)(long)iVar1;
    if (local_20 != (void *)0x0) goto LAB_001c0f03;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_20 = (void *)(long)iVar1;
    if (local_20 != (void *)0x0) goto LAB_001c0f10;
    local_20 = (void *)0x1;
    if (exit_cb_called != 1) goto LAB_001c0f1d;
    local_20 = (void *)0x1;
    if (close_cb_called != 1) goto LAB_001c0f2a;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_20 = (void *)0x0;
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (local_20 == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_relative_path_cold_1();
LAB_001c0f03:
    run_test_spawn_relative_path_cold_2();
LAB_001c0f10:
    run_test_spawn_relative_path_cold_3();
LAB_001c0f1d:
    run_test_spawn_relative_path_cold_4();
LAB_001c0f2a:
    run_test_spawn_relative_path_cold_5();
  }
  handle = (char *)&stack0xffffffffffffffe0;
  run_test_spawn_relative_path_cold_6();
LAB_001c0f44:
  run_test_spawn_relative_path_cold_7();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_relative_path) {
  char* sep;

  init_process_options("spawn_helper1", exit_cb);

  exepath_size = sizeof(exepath) - 2;
  ASSERT_OK(uv_exepath(exepath, &exepath_size));
  exepath[exepath_size] = '\0';

  /* Poor man's basename(3). */
  sep = strrchr(exepath, '/');
  if (sep == NULL)
    sep = strrchr(exepath, '\\');
  ASSERT_NOT_NULL(sep);

  /* Split into dirname and basename and make basename relative. */
  memmove(sep + 2, sep, 1 + strlen(sep));
  sep[0] = '\0';
  sep[1] = '.';
  sep[2] = '/';

  options.cwd = exepath;
  options.file = options.args[0] = sep + 1;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}